

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield.hpp
# Opt level: O0

void MeanField::applySoftmaxIndividual(float *QDistribution,float *out,int idx,int dimensions)

{
  int iVar1;
  float fVar2;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  int localIdx;
  float normaliser;
  int dimensions_local;
  int idx_local;
  float *out_local;
  float *QDistribution_local;
  
  i = 0;
  for (local_2c = 0; local_2c < dimensions; local_2c = local_2c + 1) {
    iVar1 = idx * dimensions + local_2c;
    fVar2 = expf(QDistribution[iVar1]);
    out[iVar1] = fVar2;
    i = (int)(out[iVar1] + (float)i);
  }
  for (local_30 = 0; local_30 < dimensions; local_30 = local_30 + 1) {
    iVar1 = idx * dimensions + local_30;
    out[iVar1] = out[iVar1] / (float)i;
  }
  return;
}

Assistant:

__SHARED_CODE__
        inline void applySoftmaxIndividual(const float *QDistribution, float *out, int idx, int dimensions) {
        float normaliser = 0.0;
        int localIdx;
        for (int i = 0; i < dimensions; i++) {
            localIdx = idx * dimensions + i;
            out[localIdx] = expf(QDistribution[localIdx]);
            normaliser += out[localIdx];
        }

        for (int i = 0; i < dimensions; i++) {
            out[idx*dimensions + i] /= normaliser;
        }
    }